

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

ParseResult * __thiscall
cxxopts::OptionParser::parse
          (ParseResult *__return_storage_ptr__,OptionParser *this,int argc,char **argv)

{
  element_type *peVar1;
  _Hash_node_base *p_Var2;
  key_type *__k;
  char **ppcVar3;
  _Alloc_hider _Var4;
  ParseResult *pPVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  mapped_type *pmVar10;
  const_iterator cVar11;
  mapped_type *pmVar12;
  pointer psVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_type sVar15;
  shared_ptr<cxxopts::OptionDetails> *psVar16;
  ulong uVar17;
  pointer psVar18;
  pointer __k_00;
  _Hash_node_base *p_Var19;
  char *pcVar20;
  char cVar21;
  bool bVar22;
  int current;
  size_t hash_2;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  shared_ptr<cxxopts::OptionDetails> opt;
  string name;
  shared_ptr<cxxopts::OptionDetails> value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unmatched;
  ParseResult *parsed;
  size_t hash;
  int local_14c;
  char local_145;
  int local_144;
  string local_140;
  char **local_120;
  undefined1 local_118 [32];
  undefined8 local_f8;
  shared_ptr<const_cxxopts::OptionDetails> local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_88;
  vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>> *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  ParseResult *local_58;
  key_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  pointer local_38;
  
  local_14c = 1;
  __k_00 = (this->m_positional->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar21 = argc == 1;
  local_144 = argc;
  local_120 = argv;
  local_58 = __return_storage_ptr__;
  if (!(bool)cVar21) {
    pcVar20 = argv[1];
    iVar8 = strcmp(pcVar20,"--");
    if (iVar8 == 0) {
      local_14c = 2;
    }
    else {
      local_88 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->m_parsed;
      local_80 = (vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>> *)&this->m_sequential;
      do {
        paVar14 = &local_140.field_2;
        local_118._16_8_ = (pointer)0x0;
        local_118._24_8_ = (char *)0x0;
        local_118._0_8_ = (element_type *)0x0;
        local_118._8_8_ = (element_type *)0x0;
        sVar9 = strlen(pcVar20);
        std::__detail::
        __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                  (pcVar20,pcVar20 + sVar9,
                   (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)local_118,
                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                   (anonymous_namespace)::option_matcher_abi_cxx11_,0);
        uVar17 = ((long)(local_118._8_8_ - local_118._0_8_) >> 3) * -0x5555555555555555;
        if (uVar17 < 4) {
          pcVar20 = local_120[local_14c];
          if (((*pcVar20 == '-') && (pcVar20[1] != '\0')) && (this->m_allow_unrecognised == false))
          {
            std::__cxx11::string::string
                      ((string *)&local_140,pcVar20,(allocator *)local_d8._M_local_buf);
            throw_or_mimic<cxxopts::option_syntax_exception>(&local_140);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != paVar14) {
              operator_delete(local_140._M_dataplus._M_p,
                              CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                       local_140.field_2._M_local_buf[0]) + 1);
            }
          }
          std::__cxx11::string::string
                    ((string *)&local_140,local_120[local_14c],(allocator *)&local_a8);
          bVar22 = __k_00 != (this->m_positional->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
          if (bVar22) {
            bVar22 = true;
            do {
              cVar11 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&this->m_options->_M_h,__k_00);
              if (cVar11.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                  ._M_cur == (__node_type *)0x0) {
                throw_or_mimic<cxxopts::option_not_exists_exception>(__k_00);
              }
              else {
                local_d8._M_allocated_capacity =
                     *(undefined8 *)
                      (*(long *)((long)cVar11.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                       ._M_cur + 0x28) + 0x78);
                pmVar10 = std::__detail::
                          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[](local_88,&local_d8._M_allocated_capacity);
                psVar16 = (shared_ptr<cxxopts::OptionDetails> *)
                          ((long)cVar11.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                 ._M_cur + 0x28);
                iVar8 = (*((((psVar16->
                             super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>)
                            ._M_ptr)->m_value).
                           super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_Value[6])();
                if ((char)iVar8 != '\0') {
                  parse_option(this,psVar16,__k_00,&local_140);
                  break;
                }
                if (pmVar10->m_count == 0) {
                  parse_option(this,psVar16,__k_00,&local_140);
                  __k_00 = __k_00 + 1;
                  break;
                }
                __k_00 = __k_00 + 1;
              }
              bVar22 = __k_00 != (this->m_positional->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish;
            } while (bVar22);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,
                            CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                     local_140.field_2._M_local_buf[0]) + 1);
          }
          if (!bVar22) {
            std::__cxx11::string::string
                      ((string *)&local_140,local_120[local_14c],(allocator *)local_d8._M_local_buf)
            ;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_78,&local_140);
LAB_0010fe76:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p,
                              CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                       local_140.field_2._M_local_buf[0]) + 1);
            }
          }
LAB_0010fe88:
          local_14c = local_14c + 1;
        }
        else {
          psVar13 = (pointer)(local_118._0_8_ + (local_118._8_8_ - local_118._0_8_) + -0x48);
          psVar18 = psVar13;
          if (uVar17 - 8 < 0xfffffffffffffffb) {
            psVar18 = (pointer)(local_118._0_8_ + 0x60);
          }
          if (local_118._0_8_ == local_118._8_8_) {
            psVar18 = psVar13;
          }
          if ((psVar18->matched == true) &&
             ((_Hash_node_base *)(psVar18->super_pair<const_char_*,_const_char_*>).second !=
              (_Hash_node_base *)(psVar18->super_pair<const_char_*,_const_char_*>).first)) {
            psVar18 = (pointer)(local_118._0_8_ + 0x60);
            if (0xfffffffffffffffa < uVar17 - 8) {
              psVar18 = psVar13;
            }
            if (local_118._0_8_ == local_118._8_8_) {
              psVar18 = psVar13;
            }
            if (psVar18->matched == true) {
              local_140._M_dataplus._M_p = (pointer)paVar14;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_140,
                         (_Hash_node_base *)(psVar18->super_pair<const_char_*,_const_char_*>).first,
                         (psVar18->super_pair<const_char_*,_const_char_*>).second);
            }
            else {
              local_140._M_string_length = 0;
              local_140.field_2._M_local_buf[0] = '\0';
              local_140._M_dataplus._M_p = (pointer)paVar14;
            }
            if (local_140._M_string_length != 0) {
              sVar15 = 0;
              do {
                local_d8._M_allocated_capacity = (size_type)&local_c8;
                std::__cxx11::string::_M_construct((ulong)&local_d8,'\x01');
                cVar11 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find(&this->m_options->_M_h,(key_type *)&local_d8);
                if (cVar11.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  if (this->m_allow_unrecognised == false) {
                    throw_or_mimic<cxxopts::option_not_exists_exception>((string *)&local_d8);
                    goto LAB_0010f94b;
                  }
                }
                else {
LAB_0010f94b:
                  local_b8._M_allocated_capacity =
                       *(long *)((long)cVar11.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                       ._M_cur + 0x28);
                  local_b8._8_8_ =
                       *(long *)((long)cVar11.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                       ._M_cur + 0x30);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count
                           = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->
                             _M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count
                           = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->
                             _M_use_count + 1;
                    }
                  }
                  if (sVar15 + 1 == local_140._M_string_length) {
                    checked_parse_arg(this,local_144,local_120,&local_14c,
                                      (shared_ptr<cxxopts::OptionDetails> *)&local_b8,
                                      (string *)&local_d8);
                  }
                  else {
                    cVar21 = (**(code **)(**(long **)(local_b8._M_allocated_capacity + 0x60) + 0x38)
                             )();
                    if (cVar21 == '\0') {
                      throw_or_mimic<cxxopts::option_requires_argument_exception>
                                ((string *)&local_d8);
                    }
                    else {
                      (**(code **)(**(long **)(local_b8._M_allocated_capacity + 0x60) + 0x48))
                                (&local_a8);
                      local_50 = *(key_type *)(local_b8._M_allocated_capacity + 0x78);
                      pmVar10 = std::__detail::
                                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                ::operator[](local_88,&local_50);
                      local_e8.
                      super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr = (element_type *)local_b8._M_allocated_capacity;
                      local_e8.
                      super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi =
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          *(_Atomic_word *)(local_b8._8_8_ + 8) =
                               *(_Atomic_word *)(local_b8._8_8_ + 8) + 1;
                          UNLOCK();
                        }
                        else {
                          *(_Atomic_word *)(local_b8._8_8_ + 8) =
                               *(_Atomic_word *)(local_b8._8_8_ + 8) + 1;
                        }
                      }
                      OptionValue::ensure_value(pmVar10,&local_e8);
                      pmVar10->m_count = pmVar10->m_count + 1;
                      peVar1 = (pmVar10->m_value).
                               super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      ;
                      (*peVar1->_vptr_Value[3])(peVar1,&local_a8);
                      pmVar10->m_long_name =
                           &(local_e8.
                             super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_long;
                      if (local_e8.
                          super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                      {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  (local_e8.
                                   super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
                      }
                      std::vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>>::
                      emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                (local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(local_b8._M_allocated_capacity + 0x20),&local_a8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                        operator_delete(local_a8._M_dataplus._M_p,
                                        local_a8.field_2._M_allocated_capacity + 1);
                      }
                    }
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_allocated_capacity != &local_c8) {
                  operator_delete((void *)local_d8._M_allocated_capacity,
                                  CONCAT71(local_c8._M_allocated_capacity._1_7_,
                                           local_c8._M_local_buf[0]) + 1);
                }
                sVar15 = sVar15 + 1;
              } while (sVar15 != local_140._M_string_length);
            }
            goto LAB_0010fe76;
          }
          psVar18 = psVar13;
          if (uVar17 - 5 < 0xfffffffffffffffe) {
            psVar18 = (pointer)(local_118._0_8_ + 0x18);
          }
          if (local_118._0_8_ == local_118._8_8_) {
            psVar18 = psVar13;
          }
          if ((psVar18->matched != true) ||
             ((_Hash_node_base *)(psVar18->super_pair<const_char_*,_const_char_*>).second ==
              (_Hash_node_base *)(psVar18->super_pair<const_char_*,_const_char_*>).first))
          goto LAB_0010fe88;
          psVar18 = (pointer)(local_118._0_8_ + 0x18);
          if (0xfffffffffffffffd < uVar17 - 5) {
            psVar18 = psVar13;
          }
          if (local_118._0_8_ == local_118._8_8_) {
            psVar18 = psVar13;
          }
          if (psVar18->matched == true) {
            local_140._M_dataplus._M_p = (pointer)paVar14;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_140,
                       (_Hash_node_base *)(psVar18->super_pair<const_char_*,_const_char_*>).first,
                       (psVar18->super_pair<const_char_*,_const_char_*>).second);
          }
          else {
            local_140._M_string_length = 0;
            local_140.field_2._M_local_buf[0] = '\0';
            local_140._M_dataplus._M_p = (pointer)paVar14;
          }
          cVar11 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&this->m_options->_M_h,&local_140);
          if (cVar11.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
              ._M_cur != (__node_type *)0x0) {
LAB_0010fc60:
            local_e8.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = *(element_type **)
                      ((long)cVar11.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                             ._M_cur + 0x28);
            local_e8.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)cVar11.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                         ._M_cur + 0x30);
            if (local_e8.
                super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_e8.
                 super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_e8.
                      super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_e8.
                 super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_e8.
                      super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            if (local_118._0_8_ == local_118._8_8_) {
              bVar22 = false;
            }
            else {
              bVar22 = ((long)(local_118._8_8_ - local_118._0_8_) >> 3) * -0x5555555555555555 - 6U <
                       0xfffffffffffffffd;
            }
            psVar13 = (pointer)(local_118._0_8_ + 0x30);
            if (!bVar22) {
              psVar13 = (pointer)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  (local_118._8_8_ + -0x50))->_M_use_count;
            }
            if ((psVar13->matched == true) &&
               ((_Hash_node_base *)(psVar13->super_pair<const_char_*,_const_char_*>).second !=
                (_Hash_node_base *)(psVar13->super_pair<const_char_*,_const_char_*>).first)) {
              if (local_118._0_8_ == local_118._8_8_) {
                bVar22 = false;
              }
              else {
                bVar22 = ((long)(local_118._8_8_ - local_118._0_8_) >> 3) * -0x5555555555555555 - 7U
                         < 0xfffffffffffffffc;
              }
              psVar13 = (pointer)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  (local_118._8_8_ + -0x50))->_M_use_count;
              if (bVar22) {
                psVar13 = (pointer)(local_118._0_8_ + 0x48);
              }
              if (psVar13->matched == true) {
                local_d8._M_allocated_capacity = (size_type)&local_c8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_d8,
                           (_Hash_node_base *)
                           (psVar13->super_pair<const_char_*,_const_char_*>).first,
                           (psVar13->super_pair<const_char_*,_const_char_*>).second);
              }
              else {
                local_d8._M_allocated_capacity = (size_type)&local_c8;
                local_d8._8_8_ = 0;
                local_c8._M_local_buf[0] = '\0';
              }
              local_b8._M_allocated_capacity =
                   (local_e8.
                    super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_hash;
              pmVar10 = std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[](local_88,&local_b8._M_allocated_capacity);
              local_a8._M_dataplus._M_p =
                   (pointer)local_e8.
                            super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
              local_a8._M_string_length =
                   (size_type)
                   local_e8.
                   super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (local_e8.
                  super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_e8.
                   super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_e8.
                        super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_e8.
                   super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_e8.
                        super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              OptionValue::ensure_value
                        (pmVar10,(shared_ptr<const_cxxopts::OptionDetails> *)&local_a8);
              pmVar10->m_count = pmVar10->m_count + 1;
              peVar1 = (pmVar10->m_value).
                       super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              (*peVar1->_vptr_Value[3])(peVar1,&local_d8);
              pmVar10->m_long_name = (string *)(local_a8._M_dataplus._M_p + 0x20);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length
                          );
              }
              std::vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>>::
              emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                        (local_80,&(local_e8.
                                    super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->m_long,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_allocated_capacity != &local_c8) {
                operator_delete((void *)local_d8._M_allocated_capacity,
                                CONCAT71(local_c8._M_allocated_capacity._1_7_,
                                         local_c8._M_local_buf[0]) + 1);
              }
            }
            else {
              checked_parse_arg(this,local_144,local_120,&local_14c,
                                (shared_ptr<cxxopts::OptionDetails> *)&local_e8,&local_140);
            }
            if (local_e8.
                super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_e8.
                         super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            goto LAB_0010fe76;
          }
          if (this->m_allow_unrecognised != true) {
            throw_or_mimic<cxxopts::option_not_exists_exception>(&local_140);
            goto LAB_0010fc60;
          }
          std::__cxx11::string::string
                    ((string *)local_d8._M_local_buf,local_120[local_14c],(allocator *)&local_a8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_allocated_capacity != &local_c8) {
            operator_delete((void *)local_d8._M_allocated_capacity,
                            CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0])
                            + 1);
          }
          local_14c = local_14c + 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != paVar14) {
            operator_delete(local_140._M_dataplus._M_p,
                            CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                     local_140.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((element_type *)local_118._0_8_ != (element_type *)0x0) {
          operator_delete((void *)local_118._0_8_,local_118._16_8_ - local_118._0_8_);
        }
        iVar8 = local_14c;
        local_145 = local_14c == local_144;
        cVar21 = local_145;
        if ((bool)local_145) goto LAB_0010fee8;
        pcVar20 = local_120[local_14c];
        iVar7 = strcmp(pcVar20,"--");
      } while (iVar7 != 0);
      local_14c = iVar8 + 1;
      cVar21 = local_145;
    }
  }
LAB_0010fee8:
  local_145 = cVar21;
  p_Var19 = (this->m_options->_M_h)._M_before_begin._M_nxt;
  if (p_Var19 != (_Hash_node_base *)0x0) {
    do {
      p_Var2 = p_Var19[5]._M_nxt[0xc]._M_nxt;
      local_118._0_8_ = p_Var19[5]._M_nxt[0xf]._M_nxt;
      pmVar10 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->m_parsed,(key_type *)local_118);
      bVar6 = (*(code *)p_Var2->_M_nxt[5]._M_nxt)(p_Var2);
      if (((bVar6 & pmVar10->m_count == 0) == 1) && (pmVar10->m_default == false)) {
        local_118._0_8_ = p_Var19[5]._M_nxt[0xf]._M_nxt;
        pmVar10 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->m_parsed,(key_type *)local_118);
        local_118._0_8_ = p_Var19[5]._M_nxt;
        local_118._8_8_ = p_Var19[6]._M_nxt;
        if ((element_type *)local_118._8_8_ != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ppcVar3 = (char **)&(((element_type *)local_118._8_8_)->m_short)._M_string_length;
            *(int *)ppcVar3 = *(int *)ppcVar3 + 1;
            UNLOCK();
          }
          else {
            ppcVar3 = (char **)&(((element_type *)local_118._8_8_)->m_short)._M_string_length;
            *(int *)ppcVar3 = *(int *)ppcVar3 + 1;
          }
        }
        OptionValue::ensure_value(pmVar10,(shared_ptr<const_cxxopts::OptionDetails> *)local_118);
        pmVar10->m_default = true;
        pmVar10->m_long_name = (string *)(local_118._0_8_ + 0x20);
        (*((pmVar10->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_vptr_Value[4])();
        if ((element_type *)local_118._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        }
      }
      p_Var19 = p_Var19->_M_nxt;
    } while (p_Var19 != (_Hash_node_base *)0x0);
  }
  if (local_145 == '\0') {
    if (local_14c < local_144) {
      do {
        std::__cxx11::string::string
                  ((string *)local_118,local_120[local_14c],(allocator *)local_d8._M_local_buf);
        bVar22 = __k_00 != (this->m_positional->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
        if (bVar22) {
          bVar22 = true;
          do {
            cVar11 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&this->m_options->_M_h,__k_00);
            if (cVar11.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              throw_or_mimic<cxxopts::option_not_exists_exception>(__k_00);
            }
            else {
              local_140._M_dataplus._M_p =
                   *(pointer *)
                    (*(long *)((long)cVar11.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                     ._M_cur + 0x28) + 0x78);
              pmVar10 = std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&this->m_parsed,(key_type *)&local_140);
              psVar16 = (shared_ptr<cxxopts::OptionDetails> *)
                        ((long)cVar11.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                               ._M_cur + 0x28);
              iVar8 = (*((((psVar16->
                           super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->m_value).
                         super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        )->_vptr_Value[6])();
              if ((char)iVar8 != '\0') {
                parse_option(this,psVar16,__k_00,(string *)local_118);
                break;
              }
              if (pmVar10->m_count == 0) {
                parse_option(this,psVar16,__k_00,(string *)local_118);
                __k_00 = __k_00 + 1;
                break;
              }
              __k_00 = __k_00 + 1;
            }
            bVar22 = __k_00 != (this->m_positional->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
          } while (bVar22);
        }
        if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
      } while ((bVar22) && (local_14c = local_14c + 1, local_14c < local_144));
    }
    if (local_14c != local_144) {
      do {
        std::__cxx11::string::string
                  ((string *)local_118,local_120[local_14c],(allocator *)&local_140);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
        if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        local_14c = local_14c + 1;
      } while (local_14c != local_144);
    }
  }
  p_Var19 = (this->m_options->_M_h)._M_before_begin._M_nxt;
  if (p_Var19 != (_Hash_node_base *)0x0) {
    do {
      __k = (key_type *)p_Var19[5]._M_nxt;
      paVar14 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)((long)&__k[3].field_2 + 8);
      local_140._M_dataplus._M_p = (pointer)paVar14;
      pmVar12 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->m_keys,__k);
      _Var4._M_p = local_140._M_dataplus._M_p;
      *pmVar12 = (mapped_type)paVar14;
      pmVar12 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->m_keys,__k + 1);
      *pmVar12 = (mapped_type)_Var4._M_p;
      local_118._16_8_ = (pointer)0x0;
      local_118._24_8_ = (char *)0x0;
      local_118._0_8_ = (element_type *)0x0;
      local_118._8_8_ = (element_type *)0x0;
      local_f8 = 0;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,cxxopts::OptionValue>,std::allocator<std::pair<unsigned_long_const,cxxopts::OptionValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<unsigned_long&,cxxopts::OptionValue>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,cxxopts::OptionValue>,std::allocator<std::pair<unsigned_long_const,cxxopts::OptionValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->m_parsed,&local_140,local_118);
      if ((pointer)local_118._16_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._16_8_);
      }
      p_Var19 = p_Var19->_M_nxt;
    } while (p_Var19 != (_Hash_node_base *)0x0);
  }
  pPVar5 = local_58;
  local_48._M_allocated_capacity =
       (size_type)
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48._8_8_ =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = (this->m_sequential).
             super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseResult::ParseResult
            (local_58,&this->m_keys,&this->m_parsed,
             (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)&local_48,&local_78);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return pPVar5;
}

Assistant:

inline ParseResult
OptionParser::parse(int argc, const char* const* argv)
{
  int current = 1;
  bool consume_remaining = false;
  PositionalListIterator next_positional = m_positional.begin();

  std::vector<std::string> unmatched;

  while (current != argc)
  {
    if (strcmp(argv[current], "--") == 0)
    {
      consume_remaining = true;
      ++current;
      break;
    }

    std::match_results<const char*> result;
    std::regex_match(argv[current], result, option_matcher);

    if (result.empty())
    {
      //not a flag

      // but if it starts with a `-`, then it's an error
      if (argv[current][0] == '-' && argv[current][1] != '\0') {
        if (!m_allow_unrecognised) {
          throw_or_mimic<option_syntax_exception>(argv[current]);
        }
      }

      //if true is returned here then it was consumed, otherwise it is
      //ignored
      if (consume_positional(argv[current], next_positional))
      {
      }
      else
      {
        unmatched.push_back(argv[current]);
      }
      //if we return from here then it was parsed successfully, so continue
    }
    else
    {
      //short or long option?
      if (result[4].length() != 0)
      {
        const std::string& s = result[4];

        for (std::size_t i = 0; i != s.size(); ++i)
        {
          std::string name(1, s[i]);
          auto iter = m_options.find(name);

          if (iter == m_options.end())
          {
            if (m_allow_unrecognised)
            {
              continue;
            }
            //error
            throw_or_mimic<option_not_exists_exception>(name);
          }

          auto value = iter->second;

          if (i + 1 == s.size())
          {
            //it must be the last argument
            checked_parse_arg(argc, argv, current, value, name);
          }
          else if (value->value().has_implicit())
          {
            parse_option(value, name, value->value().get_implicit_value());
          }
          else
          {
            //error
            throw_or_mimic<option_requires_argument_exception>(name);
          }
        }
      }
      else if (result[1].length() != 0)
      {
        const std::string& name = result[1];

        auto iter = m_options.find(name);

        if (iter == m_options.end())
        {
          if (m_allow_unrecognised)
          {
            // keep unrecognised options in argument list, skip to next argument
            unmatched.push_back(argv[current]);
            ++current;
            continue;
          }
          //error
          throw_or_mimic<option_not_exists_exception>(name);
        }

        auto opt = iter->second;

        //equals provided for long option?
        if (result[2].length() != 0)
        {
          //parse the option given

          parse_option(opt, name, result[3]);
        }
        else
        {
          //parse the next argument
          checked_parse_arg(argc, argv, current, opt, name);
        }
      }

    }

    ++current;
  }

  for (auto& opt : m_options)
  {
    auto& detail = opt.second;
    const auto& value = detail->value();

    auto& store = m_parsed[detail->hash()];

    if(value.has_default() && !store.count() && !store.has_default()){
      parse_default(detail);
    }
  }

  if (consume_remaining)
  {
    while (current < argc)
    {
      if (!consume_positional(argv[current], next_positional)) {
        break;
      }
      ++current;
    }

    //adjust argv for any that couldn't be swallowed
    while (current != argc) {
      unmatched.push_back(argv[current]);
      ++current;
    }
  }

  finalise_aliases();

  ParseResult parsed(std::move(m_keys), std::move(m_parsed), std::move(m_sequential), std::move(unmatched));
  return parsed;
}